

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O0

target_ulong_conflict
helper_divweu_ppc(CPUPPCState_conflict *env,target_ulong_conflict ra,target_ulong_conflict rb,
                 uint32_t oe)

{
  uint64_t divisor;
  uint64_t dividend;
  target_ulong_conflict tStack_28;
  int overflow;
  uint64_t rt;
  uint32_t oe_local;
  target_ulong_conflict rb_local;
  target_ulong_conflict ra_local;
  CPUPPCState_conflict *env_local;
  
  _tStack_28 = 0;
  if ((ulong)rb == 0) {
    dividend._4_4_ = 1;
  }
  else {
    _tStack_28 = ((ulong)ra << 0x20) / (ulong)rb;
    dividend._4_4_ = (uint)(0xffffffff < _tStack_28);
  }
  if (dividend._4_4_ != 0) {
    tStack_28 = 0;
  }
  if (oe != 0) {
    helper_update_ov_legacy(env,dividend._4_4_);
  }
  return tStack_28;
}

Assistant:

target_ulong helper_divweu(CPUPPCState *env, target_ulong ra, target_ulong rb,
                           uint32_t oe)
{
    uint64_t rt = 0;
    int overflow = 0;

    uint64_t dividend = (uint64_t)ra << 32;
    uint64_t divisor = (uint32_t)rb;

    if (unlikely(divisor == 0)) {
        overflow = 1;
    } else {
        rt = dividend / divisor;
        overflow = rt > UINT32_MAX;
    }

    if (unlikely(overflow)) {
        rt = 0; /* Undefined */
    }

    if (oe) {
        helper_update_ov_legacy(env, overflow);
    }

    return (target_ulong)rt;
}